

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputToFont.cpp
# Opt level: O1

bool __thiscall
GrcManager::AddFeatsModFamilyAux
          (GrcManager *this,uint8 *pTblOld,size_t param_2,uint8 *pTblNew,size_t param_4,
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *vstuExtNames,vector<unsigned_short,_std::allocator<unsigned_short>_> *vnLangIds,
          vector<unsigned_short,_std::allocator<unsigned_short>_> *vnNameTblIds,
          uint16 *pchwFamilyName,size_t cchwFamilyName,
          vector<PlatEncChange,_std::allocator<PlatEncChange>_> *vpec,size_t nNameTblMinNew)

{
  ushort *puVar1;
  ushort uVar2;
  undefined2 uVar3;
  pointer pwVar4;
  bool bVar5;
  string *psVar6;
  uint8 *puVar7;
  int iVar8;
  ushort uVar9;
  pointer pbVar10;
  void **ppvVar11;
  size_t src_len;
  pointer pPVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  _Alloc_hider src;
  long lVar16;
  _Alloc_hider _Var17;
  ushort uVar18;
  uint uVar19;
  pointer pPVar20;
  ushort uVar21;
  uint uVar22;
  uint8 *puVar23;
  ulong uVar24;
  ulong uVar25;
  uint8 *puVar26;
  uint16 dibNew;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vdibOffsets16;
  vector<unsigned_short,_std::allocator<unsigned_short>_> vdibOffsets8;
  string __str_1;
  string __str;
  wstring stuWchar;
  utf16 rgch16 [512];
  unsigned_short local_5a2;
  uint local_5a0;
  uint local_59c;
  uint8 *local_598;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *local_590;
  uint8 *local_588;
  uint8 *local_580;
  uint8 *local_578;
  int local_56c;
  void *local_568;
  iterator iStack_560;
  unsigned_short *local_558;
  void *local_548;
  iterator iStack_540;
  unsigned_short *local_538;
  string local_528;
  string local_508;
  long *local_4e8;
  long local_4e0;
  long local_4d8 [2];
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  long local_448;
  pointer local_440;
  utf16 local_438 [516];
  
  uVar21 = *(ushort *)(pTblOld + 2);
  uVar9 = uVar21 << 8 | uVar21 >> 8;
  uVar2 = *(ushort *)(pTblOld + 4);
  local_56c = ((uint)(*(int *)&(vpec->
                               super__Vector_base<PlatEncChange,_std::allocator<PlatEncChange>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                     *(int *)&(vpec->
                              super__Vector_base<PlatEncChange,_std::allocator<PlatEncChange>_>).
                              _M_impl.super__Vector_impl_data._M_start) >> 4) *
              ((uint)(*(int *)&(vstuExtNames->
                               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish -
                     *(int *)&(vstuExtNames->
                              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start) >> 5) * 0x6db7 +
              (uint)uVar9;
  *(undefined2 *)pTblNew = *(undefined2 *)pTblOld;
  *(ushort *)(pTblNew + 2) = (ushort)local_56c << 8 | (ushort)local_56c >> 8;
  uVar19 = local_56c * 0xc + 6;
  uVar18 = (ushort)uVar19;
  *(ushort *)(pTblNew + 4) = uVar18 << 8 | uVar18 >> 8;
  local_588 = pTblNew + 6;
  puVar23 = pTblNew + (uVar19 & 0xffff);
  local_5a2 = 0;
  local_590 = vstuExtNames;
  if (uVar21 == 0) {
    puVar26 = (uint8 *)0x0;
  }
  else {
    local_598 = pTblOld + 6;
    local_580 = pTblOld + (ushort)(uVar2 << 8 | uVar2 >> 8);
    local_578 = (uint8 *)0x1;
    if (1 < uVar9) {
      local_578 = (uint8 *)(ulong)uVar9;
    }
    puVar26 = (uint8 *)0x0;
    iVar14 = 0;
    do {
      puVar7 = local_588;
      pPVar20 = (vpec->super__Vector_base<PlatEncChange,_std::allocator<PlatEncChange>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar15 = (int)((long)(vpec->super__Vector_base<PlatEncChange,_std::allocator<PlatEncChange>_>)
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar20 >> 4) *
               -0x49249249;
      lVar16 = (long)iVar14;
      pPVar12 = pPVar20 + lVar16;
      bVar5 = iVar14 < iVar15;
      iVar8 = iVar14;
      if (iVar14 < iVar15) {
        uVar21 = *(ushort *)(local_598 + (long)puVar26 * 0xc);
        uVar21 = uVar21 << 8 | uVar21 >> 8;
        do {
          lVar16 = lVar16 + 1;
          if ((uVar21 <= pPVar12->platformID) &&
             ((iVar8 = iVar14, pPVar12->platformID != uVar21 ||
              (uVar2 = *(ushort *)((long)(local_598 + (long)puVar26 * 0xc) + 2),
              (ushort)(uVar2 << 8 | uVar2 >> 8) <= pPVar12->encodingID)))) break;
          bVar5 = lVar16 < iVar15;
          iVar14 = iVar14 + 1;
          pPVar12 = pPVar12 + 1;
          iVar8 = iVar15;
        } while (lVar16 != iVar15);
      }
      iVar14 = iVar8;
      lVar16 = (long)puVar26 * 0xc;
      puVar1 = (ushort *)(local_598 + lVar16);
      *(undefined8 *)(local_588 + lVar16) = *(undefined8 *)(local_598 + lVar16);
      *(undefined2 *)(local_588 + lVar16 + 8) = *(undefined2 *)(local_598 + lVar16 + 8);
      if ((((bVar5) && ((pPVar12->stuFullName)._M_string_length != 0)) &&
          (pPVar12->platformID == (uint16)(*puVar1 << 8 | *puVar1 >> 8))) &&
         ((pPVar12->encodingID == (uint16)(puVar1[1] << 8 | puVar1[1] >> 8) &&
          (pPVar12->engLangID == (uint16)(puVar1[2] << 8 | puVar1[2] >> 8))))) {
        uVar21 = puVar1[3] << 8 | puVar1[3] >> 8;
        src_len = 0;
        src._M_p = (pointer)0x0;
        switch(uVar21) {
        case 1:
switchD_001beaad_caseD_1:
          src_len = cchwFamilyName;
          src._M_p = (pointer)pchwFamilyName;
          break;
        case 2:
        case 5:
          break;
        case 3:
          src._M_p = pPVar20[iVar14].stuUniqueName._M_dataplus._M_p;
          src_len = pPVar20[iVar14].stuUniqueName._M_string_length;
          break;
        case 4:
switchD_001beaad_caseD_4:
          src._M_p = pPVar20[iVar14].stuFullName._M_dataplus._M_p;
          src_len = pPVar20[iVar14].stuFullName._M_string_length;
          break;
        case 6:
          src._M_p = pPVar20[iVar14].stuPostscriptName._M_dataplus._M_p;
          src_len = pPVar20[iVar14].stuPostscriptName._M_string_length;
          break;
        default:
          if (uVar21 == 0x11) goto switchD_001beaad_caseD_4;
          if (uVar21 == 0xf) goto switchD_001beaad_caseD_1;
        }
      }
      else {
        src_len = 0;
        src._M_p = (pointer)0x0;
      }
      if (src._M_p == (pointer)0x0) {
        uVar21 = puVar1[4] << 8 | puVar1[4] >> 8;
        uVar19 = (uint)uVar21;
        memcpy(puVar23,local_580 + (ushort)(puVar1[5] << 8 | puVar1[5] >> 8),(ulong)uVar21);
      }
      else {
        uVar24 = pPVar20[iVar14].cbBytesPerChar * src_len;
        uVar19 = (uint)uVar24;
        *(ushort *)(local_588 + lVar16 + 8) = (ushort)uVar24 << 8 | (ushort)uVar24 >> 8;
        if (pPVar12->cbBytesPerChar == 2) {
          memcpy(puVar23,src._M_p,uVar24 & 0xffff);
          vstuExtNames = local_590;
          TtfUtil::SwapWString(puVar23,(uVar24 & 0xffff) >> 1);
        }
        else {
          gr::Platform_UnicodeToANSI((utf16 *)src._M_p,src_len,(char *)puVar23,src_len);
        }
      }
      uVar21 = (short)uVar19 + local_5a2;
      *(unsigned_short *)(puVar7 + lVar16 + 10) = local_5a2 << 8 | local_5a2 >> 8;
      puVar23 = puVar23 + (uVar19 & 0xffff);
      puVar26 = puVar26 + 1;
      local_5a2 = uVar21;
    } while (puVar26 != local_578);
  }
  local_548 = (void *)0x0;
  iStack_540._M_current = (unsigned_short *)0x0;
  local_538 = (unsigned_short *)0x0;
  local_558 = (unsigned_short *)0x0;
  local_568 = (void *)0x0;
  iStack_560._M_current = (unsigned_short *)0x0;
  pPVar20 = (vpec->super__Vector_base<PlatEncChange,_std::allocator<PlatEncChange>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(vpec->
                              super__Vector_base<PlatEncChange,_std::allocator<PlatEncChange>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (long)pPVar20) >> 4) *
          -0x49249249) {
    lVar16 = 0;
    local_59c = 0;
    local_5a0 = 0;
    do {
      local_598 = (uint8 *)pPVar20[lVar16].cbBytesPerChar;
      pbVar10 = (vstuExtNames->
                super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      if ((vstuExtNames->
          super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          )._M_impl.super__Vector_impl_data._M_finish != pbVar10) {
        local_440 = pPVar20 + lVar16;
        puVar26 = (uint8 *)(long)(int)puVar26;
        uVar24 = 0;
        local_448 = lVar16;
        do {
          uVar3 = local_440->platformID;
          puVar1 = (ushort *)(local_588 + (long)puVar26 * 0xc);
          *puVar1 = uVar3 << 8 | (ushort)uVar3 >> 8;
          uVar21 = local_440->encodingID;
          puVar1[1] = uVar21 << 8 | uVar21 >> 8;
          uVar2 = (vnLangIds->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                  _M_impl.super__Vector_impl_data._M_start[uVar24];
          puVar1[2] = uVar2 << 8 | uVar2 >> 8;
          uVar9 = (vnNameTblIds->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>
                  )._M_impl.super__Vector_impl_data._M_start[uVar24];
          puVar1[3] = uVar9 << 8 | uVar9 >> 8;
          uVar25 = local_440->cbBytesPerChar * pbVar10[uVar24]._M_string_length;
          uVar19 = (uint)uVar2;
          local_578 = puVar23;
          local_580 = puVar26;
          if (uVar3 == 1 && uVar21 == 0) {
            if (uVar19 != 0x409) {
              local_468._M_dataplus._M_p = (pointer)&local_468.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_468,"Windows language ID ","");
              uVar22 = 1;
              if (((9 < uVar2) && (uVar22 = 2, 99 < uVar2)) && (uVar22 = 3, 999 < uVar2)) {
                uVar22 = 5 - (uVar2 < 10000);
              }
              local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_508,(char)uVar22);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_508._M_dataplus._M_p,uVar22,uVar19);
              local_488._M_dataplus._M_p = (pointer)&local_488.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_488,
                         " cannot be converted to Macintosh; 0 (English) will be used","");
              GrcErrorList::AddItem
                        (&g_errorList,false,0x1582,(GdlObject *)0x0,(GrpLineAndFile *)0x0,&local_468
                         ,&local_508,&local_488,(string *)0x0,(string *)0x0,(string *)0x0,
                         (string *)0x0,(string *)0x0);
              vstuExtNames = local_590;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_488._M_dataplus._M_p != &local_488.field_2) {
                operator_delete(local_488._M_dataplus._M_p,
                                local_488.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_508._M_dataplus._M_p != &local_508.field_2) {
                operator_delete(local_508._M_dataplus._M_p,
                                local_508.field_2._M_allocated_capacity + 1);
              }
              psVar6 = &local_468;
              _Var17._M_p = local_468._M_dataplus._M_p;
LAB_001befe8:
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var17._M_p != &psVar6->field_2) {
                operator_delete(_Var17._M_p,(psVar6->field_2)._M_allocated_capacity + 1);
              }
            }
LAB_001beffb:
            puVar1[2] = 0;
          }
          else if (uVar21 == 3 && uVar3 == 0) {
            if (uVar2 != 0x409) {
              local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_4a8,"Windows language ID ","");
              uVar22 = 1;
              if (((9 < uVar2) && (uVar22 = 2, 99 < uVar2)) && (uVar22 = 3, 999 < uVar2)) {
                uVar22 = 5 - (uVar2 < 10000);
              }
              local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_528,(char)uVar22);
              std::__detail::__to_chars_10_impl<unsigned_int>
                        (local_528._M_dataplus._M_p,uVar22,uVar19);
              local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_4c8,
                         " cannot be translated to Unicode 2.0; language 0 will be used","");
              GrcErrorList::AddItem
                        (&g_errorList,false,0x1583,(GdlObject *)0x0,(GrpLineAndFile *)0x0,&local_4a8
                         ,&local_528,&local_4c8,(string *)0x0,(string *)0x0,(string *)0x0,
                         (string *)0x0,(string *)0x0);
              vstuExtNames = local_590;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
                operator_delete(local_4c8._M_dataplus._M_p,
                                local_4c8.field_2._M_allocated_capacity + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_528._M_dataplus._M_p != &local_528.field_2) {
                operator_delete(local_528._M_dataplus._M_p,
                                local_528.field_2._M_allocated_capacity + 1);
              }
              psVar6 = &local_4a8;
              _Var17._M_p = local_4a8._M_dataplus._M_p;
              goto LAB_001befe8;
            }
            goto LAB_001beffb;
          }
          pbVar10 = (vstuExtNames->
                    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          pwVar4 = pbVar10[uVar24]._M_dataplus._M_p;
          local_4e8 = local_4d8;
          std::__cxx11::wstring::_M_construct<wchar_t*>
                    ((wstring *)&local_4e8,pwVar4,pwVar4 + pbVar10[uVar24]._M_string_length);
          puVar23 = local_578;
          if (0 < local_4e0) {
            lVar16 = local_4e0 + 1;
            lVar13 = 0;
            do {
              *(undefined2 *)((long)local_438 + lVar13) =
                   *(undefined2 *)((long)local_4e8 + lVar13 * 2);
              lVar16 = lVar16 + -1;
              lVar13 = lVar13 + 2;
            } while (1 < lVar16);
          }
          uVar21 = (ushort)uVar25;
          if (local_598 == (uint8 *)0x2) {
            if ((local_59c & 1) == 0) {
              if (iStack_560._M_current == local_558) {
                std::vector<unsigned_short,std::allocator<unsigned_short>>::
                _M_realloc_insert<unsigned_short_const&>
                          ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_568,
                           iStack_560,&local_5a2);
              }
              else {
                *iStack_560._M_current = local_5a2;
                iStack_560._M_current = iStack_560._M_current + 1;
              }
              memcpy(puVar23,local_438,uVar25 & 0xffff);
              TtfUtil::SwapWString(puVar23,(uVar25 & 0xffff) >> 1);
LAB_001bf13a:
              local_5a2 = local_5a2 + uVar21;
              vstuExtNames = local_590;
              puVar23 = puVar23 + (uVar25 & 0xffff);
            }
          }
          else if ((local_5a0 & 1) == 0) {
            if (iStack_540._M_current == local_538) {
              std::vector<unsigned_short,std::allocator<unsigned_short>>::
              _M_realloc_insert<unsigned_short_const&>
                        ((vector<unsigned_short,std::allocator<unsigned_short>> *)&local_548,
                         iStack_540,&local_5a2);
            }
            else {
              *iStack_540._M_current = local_5a2;
              iStack_540._M_current = iStack_540._M_current + 1;
            }
            gr::Platform_UnicodeToANSI(local_438,uVar25 & 0xffff,(char *)puVar23,uVar25 & 0xffff);
            goto LAB_001bf13a;
          }
          puVar1[4] = uVar21 << 8 | uVar21 >> 8;
          ppvVar11 = &local_548;
          if (local_598 == (uint8 *)0x2) {
            ppvVar11 = &local_568;
          }
          uVar21 = *(ushort *)((long)*ppvVar11 + uVar24 * 2);
          puVar1[5] = uVar21 << 8 | uVar21 >> 8;
          if (local_4e8 != local_4d8) {
            operator_delete(local_4e8,local_4d8[0] * 4 + 4);
          }
          puVar26 = local_580 + 1;
          uVar24 = uVar24 + 1;
          pbVar10 = (vstuExtNames->
                    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar16 = local_448;
        } while (uVar24 < (ulong)((long)(vstuExtNames->
                                        super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar10
                                 >> 5));
      }
      local_5a0 = local_5a0 & 0xff;
      if (local_598 != (uint8 *)0x2) {
        local_5a0 = 1;
      }
      local_59c = local_59c & 0xff;
      if (local_598 == (uint8 *)0x2) {
        local_59c = 1;
      }
      lVar16 = lVar16 + 1;
      pPVar20 = (vpec->super__Vector_base<PlatEncChange,_std::allocator<PlatEncChange>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (lVar16 < (int)((ulong)((long)(vpec->
                                          super__Vector_base<PlatEncChange,_std::allocator<PlatEncChange>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                   (long)pPVar20) >> 4) * -0x49249249);
  }
  qsort(local_588,(ulong)(ushort)local_56c,0xc,AddFeatsModFamilyAux::NameTblEntry::Compare);
  if (local_568 != (void *)0x0) {
    operator_delete(local_568,(long)local_558 - (long)local_568);
  }
  if (local_548 != (void *)0x0) {
    operator_delete(local_548,(long)local_538 - (long)local_548);
  }
  return true;
}

Assistant:

bool GrcManager::AddFeatsModFamilyAux(uint8 * pTblOld, size_t /*cbTblOld*/, 
	uint8 * pTblNew, size_t /*cbTblNew*/,
	std::vector<std::wstring> & vstuExtNames, std::vector<uint16> & vnLangIds,
	std::vector<uint16> & vnNameTblIds, 
	uint16 * pchwFamilyName, size_t cchwFamilyName, std::vector<PlatEncChange> & vpec,
	size_t nNameTblMinNew)
{
    #pragma pack(1)
	// Struct used to store data from directory entries that need to be sorted.
	// Must match the NameRecord struct exactly.
	struct NameTblEntry
	{
		uint16 nPlatId;
		uint16 nEncId;
		uint16 nLangId;
		uint16 nNameId;
		uint16 cLength;
		uint16 ibOffset;
		static int Compare(const void * ptr1, const void * ptr2)
		{
			NameTblEntry * p1 = (NameTblEntry *) ptr1;
			NameTblEntry * p2 = (NameTblEntry *) ptr2;

			if (p1->nPlatId != p2->nPlatId)
				return read(p1->nPlatId) - read(p2->nPlatId);
			else if (p1->nEncId != p2->nEncId)
				return read(p1->nEncId) - read(p2->nEncId);
			else if (p1->nLangId != p2->nLangId)
				return read(p1->nLangId) - read(p2->nLangId);
			else
				return read(p1->nNameId) - read(p2->nNameId);
		}
	};

	FontNames * pTbl = (FontNames *)(pTblOld);
	uint16 crecOld = read(pTbl->count);
	uint16 ibStrOffsetOld = read(pTbl->string_offset);
	NameRecord * pOldRecord = pTbl->name_record;

	uint16 crecNew = (uint16)(crecOld + (int)(vstuExtNames.size() * vpec.size()));

	NameRecord * pNewRecord;

	// name table header
	((FontNames *)pTblNew)->format = pTbl->format;
	((FontNames *)pTblNew)->count = read(crecNew);
	uint16 ibStrOffsetNew = sizeof(FontNames) + (crecNew - 1) * sizeof(NameRecord);
	((FontNames *)pTblNew)->string_offset = read(ibStrOffsetNew);

    pNewRecord = ((FontNames *)pTblNew)->name_record;

	uint8 * pbNextString = pTblNew + ibStrOffsetNew;
	uint16 dibNew = 0; // delta offset

	utf16 rgch16[512];	// buffer for converting between wchar_t and utf16;

	// First copy the old records, changing any font names as needed.

	int ipec;

#ifndef NDEBUG
	for (ipec = 0; ipec < signed(vpec.size()) - 1; ipec++)
	{
		Assert((vpec[ipec].platformID < vpec[ipec + 1].platformID)
				|| (vpec[ipec].platformID == vpec[ipec + 1].platformID
					&& (vpec[ipec].encodingID < vpec[ipec + 1].encodingID ||
					    (vpec[ipec].encodingID == vpec[ipec + 1].encodingID &&
					     vpec[ipec].engLangID < vpec[ipec+1].engLangID))));
	}
#endif

	ipec = 0;
	int irec = 0; // scope of this variable is larger than for-loop below.
	for ( ; irec < crecOld; irec++)
	{
		PlatEncChange * ppec = &(vpec[ipec]);
		while(ipec < signed(vpec.size())
			&& (ppec->platformID < read(pOldRecord[irec].platform_id)
				|| (ppec->platformID == read(pOldRecord[irec].platform_id)
					&& ppec->encodingID < read(pOldRecord[irec].platform_specific_id))))
		{
			ipec++;
			ppec = &(vpec[ipec]);
		}

		pNewRecord[irec].platform_id = pOldRecord[irec].platform_id;
		pNewRecord[irec].platform_specific_id = pOldRecord[irec].platform_specific_id;
		pNewRecord[irec].language_id = pOldRecord[irec].language_id;
		pNewRecord[irec].name_id = pOldRecord[irec].name_id;
		pNewRecord[irec].length = pOldRecord[irec].length;
		//pNewRecord[irec].offset = ibStrOffsetNew + dibNew;

		size_t cchwStr = 0;
        uint16 cbStr = 0;
		uint8 * pbStr = NULL;
		if (ipec < signed(vpec.size())
			&& !ppec->stuFullName.empty() // this is a platform+encoding where we need to change the font
			&& ppec->platformID == read(pOldRecord[irec].platform_id)
			&& ppec->encodingID == read(pOldRecord[irec].platform_specific_id)
			&& ppec->engLangID == read(pOldRecord[irec].language_id))
		{
			uint16 nameID = read(pOldRecord[irec].name_id);
			switch (nameID)
			{
			case n_family:
			case n_preferredfamily:
				pbStr = (uint8 *)pchwFamilyName;
				cchwStr = cchwFamilyName;
				break;
			case n_fullname:
			case n_compatiblefull:
				pbStr = (uint8 *)vpec[ipec].stuFullName.data();
				cchwStr = vpec[ipec].stuFullName.length();
				break;
			case n_uniquename:
				pbStr = (uint8 *)vpec[ipec].stuUniqueName.data();
				cchwStr = vpec[ipec].stuUniqueName.length();
				break;
			case n_postscript:
				pbStr = (uint8 *)vpec[ipec].stuPostscriptName.data();
				cchwStr = vpec[ipec].stuPostscriptName.length();
				break;
			default:
				break;
			}
		}
		if (pbStr)
		{
			// Copy in the new string.
			cbStr = (uint16)(cchwStr * (vpec[ipec].cbBytesPerChar));
			pNewRecord[irec].length = read(cbStr);
			if (ppec->cbBytesPerChar == sizeof(utf16))
			{
				memcpy(pbNextString, pbStr, cbStr);
				TtfUtil::SwapWString(pbNextString, cbStr / sizeof(utf16)); // make big endian
			}
			else
			{
				// TODO: properly handle Macintosh encoding
				Platform_UnicodeToANSI((utf16 *)pbStr, cchwStr, (char *)pbNextString, cchwStr);
			}
		}
		else
		{
			// Copy the old string.
			cbStr = read(pOldRecord[irec].length);
			pbStr = pTblOld + ibStrOffsetOld + read(pOldRecord[irec].offset);
			memcpy(pbNextString, pbStr, cbStr);
		}
		pNewRecord[irec].offset = read(dibNew);
		dibNew += cbStr;
		pbNextString += cbStr;
	}

	// Then add the feature strings. Do this for all platform-encodings of interest.
	// The first time through, store the string data in the buffer and record the offsets
	// (do this once for 8-bit versions and once for 16-bit). For any subsequent platforms
	// and encodings, just use the same offsets.

	std::vector<uint16> vdibOffsets8, vdibOffsets16;
	bool fStringsStored8 = false;
	bool fStringsStored16 = false;
	for (ipec = 0; ipec < signed(vpec.size()); ipec++)
	{
		PlatEncChange * ppec = &(vpec[ipec]);
		bool f8bit = (ppec->cbBytesPerChar != sizeof(utf16));
		for (size_t istring = 0; istring < vstuExtNames.size(); istring++)
		{
			pNewRecord[irec].platform_id = read(ppec->platformID);
			pNewRecord[irec].platform_specific_id = read(ppec->encodingID);
			pNewRecord[irec].language_id = read(vnLangIds[istring]);
			pNewRecord[irec].name_id = read(vnNameTblIds[istring]);
			uint16 cbStr = (uint16)(vstuExtNames[istring].length() * ppec->cbBytesPerChar);

			// Convert the language IDs appropriately for the platform.
			uint16 platform_id = pNewRecord[irec].platform_id;
			uint16 specific_id = pNewRecord[irec].platform_specific_id;
			uint16 language_id = pNewRecord[irec].language_id;
#if !WORDS_BIGENDIAN
			platform_id = rev16(platform_id);
			specific_id = rev16(specific_id);
			language_id = rev16(language_id);
#endif
			if (platform_id == NameRecord::Macintosh && specific_id == 0) // Roman
			{
				// TODO: Convert common Windows language codes to Macintosh
				if (language_id != LG_USENG)
				{
					g_errorList.AddWarning(5506, NULL,
						"Windows language ID ", std::to_string(language_id),
						" cannot be converted to Macintosh; 0 (English) will be used");
				}
				pNewRecord[irec].language_id = 0;	// Macintosh English
			}
			else if (platform_id == 0 && specific_id == 3) // Unicode, >= 2.0
			{
				if (language_id != LG_USENG)
				{
					g_errorList.AddWarning(5507, NULL,
						"Windows language ID ", std::to_string(language_id),
						" cannot be translated to Unicode 2.0; language 0 will be used");
				}
				pNewRecord[irec].language_id = 0;	// whatever, this is our best guess
			}

			// Convert from wchar_t to 16-bit chars.
			std::wstring stuWchar = vstuExtNames[istring];
			std::copy(stuWchar.data(), stuWchar.data() + stuWchar.length(), rgch16);

			if (f8bit && !fStringsStored8)
			{
				vdibOffsets8.push_back(dibNew);
				// TODO: properly handle Macintosh encoding
				Platform_UnicodeToANSI(rgch16, cbStr, (char *)pbNextString, cbStr);
				dibNew += cbStr;
				pbNextString += cbStr;
			}
			else if (!f8bit && !fStringsStored16)
			{
				vdibOffsets16.push_back(dibNew);
				memcpy(pbNextString, rgch16, cbStr);
				TtfUtil::SwapWString(pbNextString, cbStr / sizeof(utf16)); // make big endian
				dibNew += cbStr;
				pbNextString += cbStr;
			}
			// else the string has already been stored, and we've saved the offset.

			pNewRecord[irec].length = read(cbStr);
			pNewRecord[irec].offset = (f8bit) ?
				read(vdibOffsets8[istring]):
				read(vdibOffsets16[istring]);
			irec++;
		}

		(f8bit) ?
			fStringsStored8 = true:
			fStringsStored16 = true;
	}

	Assert(irec == crecNew);

	// Sort list of entries.
	::qsort(reinterpret_cast<NameTblEntry *>(pNewRecord), crecNew, sizeof(NameTblEntry), NameTblEntry::Compare);

	return true;
}